

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void hideOrShowWidgetsInLayout(QLayout *layout,bool on)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  QLayout *layout_00;
  int i;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)layout + 200))(layout);
    if (iVar1 <= iVar5) break;
    plVar2 = (long *)(**(code **)(*(long *)layout + 0xa8))(layout,iVar5);
    plVar3 = (long *)(**(code **)(*plVar2 + 0x68))(plVar2);
    if (plVar3 == (long *)0x0) {
      lVar4 = (**(code **)(*plVar2 + 0x70))(plVar2);
      if (lVar4 != 0) {
        layout_00 = (QLayout *)(**(code **)(*plVar2 + 0x70))(plVar2);
        hideOrShowWidgetsInLayout(layout_00,on);
      }
    }
    else {
      (**(code **)(*plVar3 + 0x68))(plVar3,on);
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

static void hideOrShowWidgetsInLayout(QLayout *layout, bool on)
{
    for (int i = 0; i < layout->count(); ++i) {
        QLayoutItem *item = layout->itemAt(i);
        if (QWidget *widget = item->widget())
            widget->setVisible(on);
        else if (item->layout())
            hideOrShowWidgetsInLayout(item->layout(), on);
    }
}